

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# didxset.cpp
# Opt level: O1

void __thiscall soplex::DIdxSet::DIdxSet(DIdxSet *this,int n)

{
  (this->super_IdxSet).num = 0;
  (this->super_IdxSet).len = 0;
  (this->super_IdxSet).idx = (int *)0x0;
  (this->super_IdxSet).freeArray = false;
  (this->super_IdxSet)._vptr_IdxSet = (_func_int **)&PTR__DIdxSet_003af7b8;
  if (n < 2) {
    n = 1;
  }
  (this->super_IdxSet).len = n;
  spx_alloc<int*>(&(this->super_IdxSet).idx,n);
  return;
}

Assistant:

DIdxSet::DIdxSet(int n)
   : IdxSet()
{
   len = (n < 1) ? 1 : n;
   spx_alloc(idx, len);
}